

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

StatusOr<google::protobuf::FeatureResolver> *
google::protobuf::FeatureResolver::Create
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *compiled_defaults)

{
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this;
  int iVar1;
  void *pvVar2;
  _func_int **pp_Var3;
  void **ppvVar4;
  FeatureSet *from;
  Edition EVar5;
  undefined1 *puVar6;
  Status *this_00;
  string_view message;
  StatusOr<google::protobuf::FeatureSet> features;
  Status _status;
  Status local_240;
  Edition local_238;
  int local_234;
  FeatureSetDefaults *local_230;
  void **local_228;
  Edition local_21c;
  string_view local_218;
  FeatureSet local_1c0;
  string local_170;
  StringifySink local_150;
  StringifySink local_130;
  AlphaNum local_110;
  FeatureSet local_e0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  EVar5 = (compiled_defaults->field_0)._impl_.minimum_edition_;
  if ((int)edition < (int)EVar5) {
    protobuf::(anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&local_218,"Edition ",edition,
               " is earlier than the minimum supported edition ",EVar5);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
               (Status *)&local_218);
  }
  else {
    EVar5 = (compiled_defaults->field_0)._impl_.maximum_edition_;
    if ((int)EVar5 < (int)edition) {
      protobuf::(anonymous_namespace)::
      Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
                ((_anonymous_namespace_ *)&local_218,"Edition ",edition,
                 " is later than the maximum supported edition ",EVar5);
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
      StatusOrData<absl::lts_20250127::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                 (Status *)&local_218);
    }
    else {
      this = &(compiled_defaults->field_0)._impl_.defaults_;
      local_238 = edition;
      local_230 = compiled_defaults;
      ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
      local_228 = (void **)RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                           ::end(this);
      EVar5 = EDITION_UNKNOWN;
      while( true ) {
        if (ppvVar4 == local_228) {
          internal::GetEditionFeatureSetDefaults
                    ((StatusOr<google::protobuf::FeatureSet> *)&local_218,local_238,local_230);
          absl::lts_20250127::Status::Status((Status *)&local_1c0,(Status *)&local_218);
          if (local_1c0.super_Message.super_MessageLite._vptr_MessageLite == (_func_int **)0x1) {
            absl::lts_20250127::Status::~Status((Status *)&local_1c0);
            from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::value
                             ((StatusOr<google::protobuf::FeatureSet> *)&local_218);
            FeatureSet::FeatureSet(&local_e0,from);
            FeatureSet::FeatureSet(&local_1c0,&local_e0);
            absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
            StatusOrData<google::protobuf::FeatureResolver>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureResolver>,&local_1c0);
            FeatureSet::~FeatureSet(&local_1c0);
            FeatureSet::~FeatureSet(&local_e0);
          }
          else {
            absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
            StatusOrData<const_absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureResolver>,(Status *)&local_1c0);
            absl::lts_20250127::Status::~Status((Status *)&local_1c0);
          }
          absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
          ~StatusOrData((StatusOrData<google::protobuf::FeatureSet> *)&local_218);
          return __return_storage_ptr__;
        }
        pvVar2 = *ppvVar4;
        iVar1 = *(int *)((long)pvVar2 + 0x28);
        if (iVar1 == 0) break;
        if (iVar1 <= (int)EVar5 && EVar5 != EDITION_UNKNOWN) {
          local_234 = iVar1;
          local_21c = EVar5;
          local_218 = absl::lts_20250127::NullSafeStringView
                                ("Feature set defaults are not strictly increasing.  Edition ");
          local_130.buffer_._M_dataplus._M_p = (pointer)&local_130.buffer_.field_2;
          local_130.buffer_.field_2._M_allocated_capacity = 0;
          local_130.buffer_.field_2._8_8_ = 0;
          local_130.buffer_._M_string_length = 0;
          local_1c0.super_Message.super_MessageLite =
               (MessageLite)
               absl::lts_20250127::strings_internal::
               ExtractStringification<google::protobuf::Edition>(&local_130,&local_21c);
          local_110.piece_ =
               absl::lts_20250127::NullSafeStringView(" is greater than or equal to edition ");
          local_150.buffer_._M_dataplus._M_p = (pointer)&local_150.buffer_.field_2;
          local_150.buffer_.field_2._M_allocated_capacity = 0;
          local_150.buffer_.field_2._8_8_ = 0;
          local_150.buffer_._M_string_length = 0;
          local_60.piece_ =
               absl::lts_20250127::strings_internal::
               ExtractStringification<google::protobuf::Edition>(&local_150,(Edition *)&local_234);
          local_90.piece_ = absl::lts_20250127::NullSafeStringView(".");
          absl::lts_20250127::StrCat<>
                    (&local_170,(AlphaNum *)&local_218,(AlphaNum *)&local_1c0,&local_110,&local_60,
                     &local_90);
          message._M_str = (char *)local_170._M_string_length;
          message._M_len = (size_t)&local_240;
          absl::lts_20250127::FailedPreconditionError(message);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_130);
          absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
          StatusOrData<absl::lts_20250127::Status,_0>
                    (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                     &local_240);
          this_00 = &local_240;
          goto LAB_003450f1;
        }
        puVar6 = *(undefined1 **)((long)pvVar2 + 0x20);
        if ((FeatureSet *)puVar6 == (FeatureSet *)0x0) {
          puVar6 = _FeatureSet_default_instance_;
        }
        FeatureSet::FeatureSet((FeatureSet *)&local_218,(FeatureSet *)puVar6);
        puVar6 = *(undefined1 **)((long)pvVar2 + 0x18);
        if ((MessageLite *)puVar6 == (MessageLite *)0x0) {
          puVar6 = _FeatureSet_default_instance_;
        }
        FeatureSet::MergeImpl((MessageLite *)&local_218,(MessageLite *)puVar6);
        anon_unknown_21::ValidateMergedFeatures
                  ((anon_unknown_21 *)&local_1c0,(FeatureSet *)&local_218);
        pp_Var3 = local_1c0.super_Message.super_MessageLite._vptr_MessageLite;
        if (local_1c0.super_Message.super_MessageLite._vptr_MessageLite == (_func_int **)0x1) {
          absl::lts_20250127::Status::~Status((Status *)&local_1c0);
          EVar5 = *(Edition *)((long)pvVar2 + 0x28);
        }
        else {
          absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
          StatusOrData<const_absl::lts_20250127::Status,_0>
                    (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                     (Status *)&local_1c0);
          absl::lts_20250127::Status::~Status((Status *)&local_1c0);
        }
        FeatureSet::~FeatureSet((FeatureSet *)&local_218);
        ppvVar4 = ppvVar4 + 1;
        if (pp_Var3 != (_func_int **)0x1) {
          return __return_storage_ptr__;
        }
      }
      protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
                ((_anonymous_namespace_ *)&local_218,"Invalid edition ",EDITION_UNKNOWN,
                 " specified.");
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
      StatusOrData<absl::lts_20250127::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                 (Status *)&local_218);
    }
  }
  this_00 = (Status *)&local_218;
LAB_003450f1:
  absl::lts_20250127::Status::~Status(this_00);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureResolver> FeatureResolver::Create(
    Edition edition, const FeatureSetDefaults& compiled_defaults) {
  if (edition < compiled_defaults.minimum_edition()) {
    return Error("Edition ", edition,
                 " is earlier than the minimum supported edition ",
                 compiled_defaults.minimum_edition());
  }
  if (compiled_defaults.maximum_edition() < edition) {
    return Error("Edition ", edition,
                 " is later than the maximum supported edition ",
                 compiled_defaults.maximum_edition());
  }

  // Validate compiled defaults.
  Edition prev_edition = EDITION_UNKNOWN;
  for (const auto& edition_default : compiled_defaults.defaults()) {
    if (edition_default.edition() == EDITION_UNKNOWN) {
      return Error("Invalid edition ", edition_default.edition(),
                   " specified.");
    }
    if (prev_edition != EDITION_UNKNOWN) {
      if (edition_default.edition() <= prev_edition) {
        return Error(
            "Feature set defaults are not strictly increasing.  Edition ",
            prev_edition, " is greater than or equal to edition ",
            edition_default.edition(), ".");
      }
    }
    FeatureSet features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    RETURN_IF_ERROR(ValidateMergedFeatures(features));

    prev_edition = edition_default.edition();
  }

  auto features =
      internal::GetEditionFeatureSetDefaults(edition, compiled_defaults);
  RETURN_IF_ERROR(features.status());
  return FeatureResolver(std::move(features.value()));
}